

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O1

void dynamic_suite::run(void)

{
  test_null();
  test_boolean();
  test_integer();
  test_number();
  test_string();
  test_array();
  test_array_nested_array();
  test_map();
  test_map_nested_array();
  test_bad();
  return;
}

Assistant:

void run()
{
    test_null();
    test_boolean();
    test_integer();
    test_number();
    test_string();
    test_array();
    test_array_nested_array();
    test_map();
    test_map_nested_array();
    test_bad();
}